

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_decodeFrameHeader(ZSTD_DCtx *dctx,void *src,size_t headerSize)

{
  uint uVar1;
  size_t sStack_10;
  
  sStack_10 = ZSTD_getFrameHeader_advanced(&dctx->fParams,src,headerSize,dctx->format);
  if (sStack_10 < 0xffffffffffffff89) {
    if (sStack_10 == 0) {
      uVar1 = (dctx->fParams).dictID;
      if ((uVar1 == 0) || (dctx->dictID == uVar1)) {
        if ((dctx->fParams).checksumFlag != 0) {
          (dctx->xxhState).total_len = 0;
          (dctx->xxhState).v1 = 0x60ea27eeadc0b5d6;
          (dctx->xxhState).v2 = 0xc2b2ae3d27d4eb4f;
          (dctx->xxhState).v3 = 0;
          (dctx->xxhState).v4 = 0x61c8864e7a143579;
          (dctx->xxhState).mem64[0] = 0;
          (dctx->xxhState).mem64[1] = 0;
          (dctx->xxhState).mem64[2] = 0;
          (dctx->xxhState).mem64[3] = 0;
          (dctx->xxhState).memsize = 0;
          (dctx->xxhState).reserved[0] = 0;
        }
        sStack_10 = 0;
      }
      else {
        sStack_10 = 0xffffffffffffffe0;
      }
    }
    else {
      sStack_10 = 0xffffffffffffffb8;
    }
  }
  return sStack_10;
}

Assistant:

static size_t ZSTD_decodeFrameHeader(ZSTD_DCtx* dctx, const void* src, size_t headerSize)
{
    size_t const result = ZSTD_getFrameHeader_advanced(&(dctx->fParams), src, headerSize, dctx->format);
    if (ZSTD_isError(result)) return result;    /* invalid header */
    RETURN_ERROR_IF(result>0, srcSize_wrong, "headerSize too small");
#ifndef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
    /* Skip the dictID check in fuzzing mode, because it makes the search
     * harder.
     */
    RETURN_ERROR_IF(dctx->fParams.dictID && (dctx->dictID != dctx->fParams.dictID),
                    dictionary_wrong);
#endif
    if (dctx->fParams.checksumFlag) XXH64_reset(&dctx->xxhState, 0);
    return 0;
}